

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O0

void __thiscall xray_re::xr_ini_writer::open_section(xr_ini_writer *this,string *format,...)

{
  char *pcVar1;
  size_type sVar2;
  reference __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  allocator<char> local_4d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  undefined1 local_4b0 [8];
  string section;
  undefined1 local_460 [8];
  string prev_section;
  char local_438 [4];
  int n;
  char buf [1024];
  va_list ap;
  string *format_local;
  xr_ini_writer *this_local;
  
  buf[0x3fc] = '0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  buf[0x3f8] = '\x10';
  buf[0x3f9] = '\0';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  pcVar1 = (char *)std::__cxx11::string::c_str();
  prev_section.field_2._12_4_ = vsnprintf(local_438,0x400,pcVar1,buf + 0x3f8);
  if (prev_section.field_2._12_4_ != 0) {
    std::__cxx11::string::string((string *)local_460);
    sVar2 = std::
            stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(&this->m_section_stack);
    if (sVar2 != 0) {
      __lhs = std::
              stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::top(&this->m_section_stack);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&section.field_2 + 8),__lhs,"_");
      std::__cxx11::string::operator=
                ((string *)local_460,(string *)(section.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(section.field_2._M_local_buf + 8));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,local_438,&local_4d1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                   &local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    std::operator+(&local_518,"[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0);
    std::operator+(&local_4f8,&local_518,"]\n");
    pcVar1 = (char *)std::__cxx11::string::c_str();
    xr_writer::w_sf((xr_writer *)this,pcVar1,buf + 0x3f8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)&local_518);
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push(&this->m_section_stack,(value_type *)local_4b0);
    std::__cxx11::string::~string((string *)local_4b0);
    std::__cxx11::string::~string((string *)local_460);
  }
  return;
}

Assistant:

void xr_ini_writer::open_section(std::string format, ...)
{
	va_list ap;
	va_start(ap, format);

	char buf[1024];
#if defined(_MSC_VER) && _MSC_VER >= 1400
	int n = vsprintf_s(buf, sizeof(buf), format.c_str(), ap);
#else
	int n = vsnprintf(buf, sizeof(buf), format.c_str(), ap);
#endif
	va_end(ap);
	if (n == 0)
		return;

	std::string prev_section;
	if (m_section_stack.size() > 0)
		prev_section = m_section_stack.top() + "_";

	std::string section(prev_section + std::string(buf));

	w_sf(("[" + section + "]\n").c_str(), ap);

	m_section_stack.push(section);

	va_end(ap);
}